

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond_test.c
# Opt level: O0

void test_resp_poll_writeable(void)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  nng_err result__7;
  nng_err result__6;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  nng_err result__5;
  int rv_;
  size_t sz_;
  char buf_ [64];
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_socket resp;
  nng_socket surv;
  int fd;
  
  nVar2 = nng_surveyor0_open((nng_socket *)&result_);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x39,"%s: expected success, got %s (%d)","nng_surveyor0_open(&surv)",
                         pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_respondent0_open((nng_socket *)&result__1);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x3a,"%s: expected success, got %s (%d)","nng_respondent0_open(&resp)",
                         pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_socket_get_send_poll_fd((nng_socket)result__1,(int *)&resp);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x3b,"%s: expected success, got %s (%d)",
                         "nng_socket_get_send_poll_fd(resp, &fd)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(-1 < (int)resp.id),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x3c,"%s","fd >= 0");
  _Var1 = nuts_poll_fd(resp.id);
  acutest_check_((uint)!_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x3f,"%s","nuts_poll_fd(fd) == false");
  buf_._60_4_ = nuts_marry((nng_socket)result_,(nng_socket)result__1);
  bVar5 = buf_._60_4_ == NNG_OK;
  pcVar4 = nng_strerror(buf_._60_4_);
  iVar3 = acutest_check_((uint)bVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x41,"%s: expected success, got %s (%d)","nuts_marry(surv, resp)",pcVar4,
                         buf_._60_4_);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  _Var1 = nuts_poll_fd(resp.id);
  acutest_check_((uint)!_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x44,"%s","nuts_poll_fd(fd) == false");
  buf_._56_4_ = nng_send((nng_socket)result_,"abc",4,0);
  bVar5 = buf_._56_4_ == NNG_OK;
  pcVar4 = nng_strerror(buf_._56_4_);
  uVar6 = buf_._56_4_;
  iVar3 = acutest_check_((uint)bVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x47,"%s: expected success, got %s (%d)",
                         "nng_send(surv, \"abc\", strlen(\"abc\") + 1, 0)",pcVar4,buf_._56_4_);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  _result__5 = 0x40;
  nVar2 = nng_recv((nng_socket)result__1,&sz_,(size_t *)&result__5,0);
  buf__1._60_4_ = nVar2;
  pcVar4 = nng_strerror(nVar2);
  acutest_check_((uint)(nVar2 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x48,"nng_recv (%d %s)",(ulong)nVar2,pcVar4,uVar6);
  acutest_check_((uint)(_result__5 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x48,"length %d want %d",_result__5 & 0xffffffff,4);
  buf_[0x37] = '\0';
  iVar3 = strcmp("abc",(char *)&sz_);
  acutest_check_((uint)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x48,"%s == %s","abc",&sz_);
  _Var1 = nuts_poll_fd(resp.id);
  acutest_check_((uint)_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x49,"%s","nuts_poll_fd(fd) == true");
  buf__1._56_4_ = nng_send((nng_socket)result__1,"def",4,0);
  bVar5 = buf__1._56_4_ == NNG_OK;
  pcVar4 = nng_strerror(buf__1._56_4_);
  iVar3 = acutest_check_((uint)bVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x4c,"%s: expected success, got %s (%d)",
                         "nng_send(resp, \"def\", strlen(\"def\") + 1, 0)",pcVar4,buf__1._56_4_);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  _Var1 = nuts_poll_fd(resp.id);
  acutest_check_((uint)!_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x4d,"%s","nuts_poll_fd(fd) == false");
  _result__6 = 0x40;
  nVar2 = nng_recv((nng_socket)result_,&sz__1,(size_t *)&result__6,0);
  pcVar4 = nng_strerror(nVar2);
  acutest_check_((uint)(nVar2 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x4f,"nng_recv (%d %s)",(ulong)nVar2,pcVar4);
  acutest_check_((uint)(_result__6 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x4f,"length %d want %d",_result__6 & 0xffffffff,4);
  buf__1[0x37] = '\0';
  iVar3 = strcmp("def",(char *)&sz__1);
  acutest_check_((uint)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x4f,"%s == %s","def",&sz__1);
  _Var1 = nuts_poll_fd(resp.id);
  acutest_check_((uint)!_Var1,
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                 ,0x50,"%s","nuts_poll_fd(fd) == false");
  nVar2 = nng_socket_close((nng_socket)result_);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x52,"%s: expected success, got %s (%d)","nng_socket_close(surv)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_socket_close((nng_socket)result__1);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/respond_test.c"
                         ,0x53,"%s: expected success, got %s (%d)","nng_socket_close(resp)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_resp_poll_writeable(void)
{
	int        fd;
	nng_socket surv;
	nng_socket resp;

	NUTS_PASS(nng_surveyor0_open(&surv));
	NUTS_PASS(nng_respondent0_open(&resp));
	NUTS_PASS(nng_socket_get_send_poll_fd(resp, &fd));
	NUTS_TRUE(fd >= 0);

	// Not writable before connect.
	NUTS_TRUE(nuts_poll_fd(fd) == false);

	NUTS_MARRY(surv, resp);

	// Still not writable.
	NUTS_TRUE(nuts_poll_fd(fd) == false);

	// If we get a job, *then* we become writable
	NUTS_SEND(surv, "abc");
	NUTS_RECV(resp, "abc");
	NUTS_TRUE(nuts_poll_fd(fd) == true);

	// And is no longer writable once we send a message
	NUTS_SEND(resp, "def");
	NUTS_TRUE(nuts_poll_fd(fd) == false);
	// Even after receiving it
	NUTS_RECV(surv, "def");
	NUTS_TRUE(nuts_poll_fd(fd) == false);

	NUTS_CLOSE(surv);
	NUTS_CLOSE(resp);
}